

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerEncode.h
# Opt level: O2

size_t GetDataSize<PolicyQualifierInfo>
                 (vector<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_> *in)

{
  pointer pPVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar4 = 0;
  uVar2 = 0;
  while( true ) {
    pPVar1 = (in->super__Vector_base<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(in->
                       super__Vector_base<PolicyQualifierInfo,_std::allocator<PolicyQualifierInfo>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x68) <=
        (ulong)uVar2) break;
    sVar3 = DerBase::EncodedSize(&pPVar1[uVar2].super_DerBase);
    sVar4 = sVar4 + sVar3;
    uVar2 = uVar2 + 1;
  }
  return sVar4;
}

Assistant:

size_t GetDataSize(std::vector<T>& in) 
{
	size_t ret = 0;
	for (unsigned int i = 0; i < in.size(); ++i)
	{
		ret += in[i].EncodedSize();
	}

	return ret;
}